

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall
QAbstractItemViewPrivate::columnsInserted
          (QAbstractItemViewPrivate *this,QModelIndex *index,int start,int end)

{
  bool bVar1;
  QObject *obj;
  ulong uVar2;
  int in_ECX;
  int in_EDX;
  QAbstractItemViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemView *q;
  QAccessibleTableModelChangeEvent accessibleEvent;
  QAccessibleTableModelChangeEvent local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  obj = (QObject *)q_func(in_RDI);
  bVar1 = QWidget::isVisible((QWidget *)0x80ec66);
  if (bVar1) {
    (**(code **)(*(long *)obj + 0x260))();
  }
  uVar2 = QAccessible::isActive();
  if ((uVar2 & 1) != 0) {
    memset(local_38,0xaa,0x30);
    QAccessibleTableModelChangeEvent::QAccessibleTableModelChangeEvent
              ((QAccessibleTableModelChangeEvent *)CONCAT44(in_EDX,in_ECX),obj,
               (ModelChangeType)((ulong)in_RDI >> 0x20));
    QAccessibleTableModelChangeEvent::setFirstColumn(local_38,in_EDX);
    QAccessibleTableModelChangeEvent::setLastColumn(local_38,in_ECX);
    QAccessible::updateAccessibility((QAccessibleEvent *)local_38);
    QAccessibleTableModelChangeEvent::~QAccessibleTableModelChangeEvent(local_38);
  }
  updateGeometry(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemViewPrivate::columnsInserted(const QModelIndex &index, int start, int end)
{
    Q_UNUSED(index);
    Q_UNUSED(start);
    Q_UNUSED(end);

    Q_Q(QAbstractItemView);
    if (q->isVisible())
        q->updateEditorGeometries();
#if QT_CONFIG(accessibility)
    if (QAccessible::isActive()) {
        QAccessibleTableModelChangeEvent accessibleEvent(q, QAccessibleTableModelChangeEvent::ColumnsInserted);
        accessibleEvent.setFirstColumn(start);
        accessibleEvent.setLastColumn(end);
        QAccessible::updateAccessibility(&accessibleEvent);
    }
#endif
    updateGeometry();
}